

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O1

int32_t argv2int(jit_State *J,TValue *o)

{
  int iVar1;
  ulong uVar2;
  
  uVar2 = o->it64 >> 0x2f;
  if (0xfffffffffffffff2 < uVar2) {
    if (uVar2 == 0xfffffffffffffffb) {
      iVar1 = lj_strscan_num((GCstr *)(o->it64 & 0x7fffffffffff),o);
      if (iVar1 != 0) goto LAB_00155392;
    }
    lj_trace_err(J,LJ_TRERR_BADTYPE);
  }
LAB_00155392:
  return (int)o->n;
}

Assistant:

static int32_t argv2int(jit_State *J, TValue *o)
{
  if (!lj_strscan_numberobj(o))
    lj_trace_err(J, LJ_TRERR_BADTYPE);
  return tvisint(o) ? intV(o) : lj_num2int(numV(o));
}